

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

bool __thiscall
xray_re::xr_object::save_object(xr_object *this,char *path,compress_options compress)

{
  bool bVar1;
  size_t size;
  xr_memory_writer file;
  xr_memory_writer w;
  xr_memory_writer local_4110;
  xr_memory_writer local_2098;
  
  xr_memory_writer::xr_memory_writer(&local_2098);
  (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[0xb])(this,&local_2098);
  xr_memory_writer::xr_memory_writer(&local_4110);
  size = xr_memory_writer::tell(&local_2098);
  xr_writer::w_raw_chunk
            (&local_4110.super_xr_writer,0x7777,
             local_2098.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,size,compress != none);
  bVar1 = xr_memory_writer::save_to(&local_4110,path);
  xr_memory_writer::~xr_memory_writer(&local_4110);
  xr_memory_writer::~xr_memory_writer(&local_2098);
  return bVar1;
}

Assistant:

bool xr_object::save_object(const char* path, compress_options compress) const
{
	xr_memory_writer w;
	save_object(w);

	xr_memory_writer file;
	file.w_raw_chunk(EOBJ_CHUNK_MAIN, w.data(), w.tell(), compress != compress_options::none);

	bool status = file.save_to(path);
	return status;
}